

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_pvrtc1_4.cpp
# Opt level: O1

bool __thiscall
basisu::pvrtc4_image::get_interpolated_colors
          (pvrtc4_image *this,uint32_t x,uint32_t y,color_rgba *pColors)

{
  uint32_t uVar1;
  int iVar2;
  ulong uVar3;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar4;
  uint32_t c_1;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int v_interp;
  uint uVar11;
  int u_interp;
  uint32_t c;
  uint uVar12;
  long lVar13;
  short sVar21;
  undefined1 auVar16 [15];
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar15;
  short sVar14;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  undefined1 auVar17 [16];
  short sVar27;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar28 [16];
  color_rgba result;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_5c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_58;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_54;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_50;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_4c;
  ulong local_48;
  ulong local_40;
  anon_union_4_2_6eba8969_for_color_rgba_0 *local_38;
  
  if ((this->m_width <= x) || (this->m_height <= y)) {
    __assert_fail("(x < m_width) && (y < m_height)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_pvrtc1_4.cpp"
                  ,0x12e,
                  "bool basisu::pvrtc4_image::get_interpolated_colors(uint32_t, uint32_t, color_rgba *) const"
                 );
  }
  uVar3 = (ulong)x;
  uVar11 = (int)(x - 2) >> 2;
  uVar1 = this->m_block_width;
  if ((int)uVar11 < 0) {
    uVar8 = (int)uVar11 % (int)uVar1 + uVar1;
    if ((int)uVar11 % (int)uVar1 == 0) {
      uVar8 = 0;
    }
  }
  else {
    uVar8 = uVar11;
    if ((int)uVar1 <= (int)uVar11) {
      uVar8 = (int)uVar11 % (int)uVar1;
    }
  }
  uVar6 = (int)(y - 2) >> 2;
  uVar12 = uVar11 + 1;
  if ((int)uVar11 < -1) {
    iVar9 = (int)uVar12 % (int)uVar1;
    uVar12 = uVar1 + iVar9;
    if (iVar9 == 0) {
      uVar12 = 0;
    }
  }
  else if ((int)uVar1 <= (int)uVar12) {
    uVar12 = (int)uVar12 % (int)uVar1;
  }
  uVar1 = this->m_block_height;
  if ((int)uVar6 < 0) {
    uVar11 = (int)uVar6 % (int)uVar1 + uVar1;
    if ((int)uVar6 % (int)uVar1 == 0) {
      uVar11 = 0;
    }
  }
  else {
    uVar11 = uVar6;
    if ((int)uVar1 <= (int)uVar6) {
      uVar11 = (int)uVar6 % (int)uVar1;
    }
  }
  uVar10 = uVar6 + 1;
  if ((int)uVar6 < -1) {
    iVar9 = (int)uVar10 % (int)uVar1;
    uVar10 = uVar1 + iVar9;
    if (iVar9 == 0) {
      uVar10 = 0;
    }
  }
  else if ((int)uVar1 <= (int)uVar10) {
    uVar10 = (int)uVar10 % (int)uVar1;
  }
  uVar6 = (this->m_blocks).m_width;
  if ((uVar8 < uVar6) && (uVar11 < (this->m_blocks).m_height)) {
    uVar6 = uVar6 * uVar11 + uVar8;
    local_48 = (ulong)y;
    if (uVar6 < (this->m_blocks).m_values.m_size) {
      local_50.field_1 =
           (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
           pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar6,0);
      uVar6 = (this->m_blocks).m_width;
      if ((uVar6 <= uVar12) || ((this->m_blocks).m_height <= uVar11)) goto LAB_002510e4;
      uVar6 = uVar6 * uVar11 + uVar12;
      if (uVar6 < (this->m_blocks).m_values.m_size) {
        local_54.field_1 =
             (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
             pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar6,0);
        uVar6 = (this->m_blocks).m_width;
        if ((uVar6 <= uVar8) || ((this->m_blocks).m_height <= uVar10)) goto LAB_002510e4;
        uVar6 = uVar6 * uVar10 + uVar8;
        if (uVar6 < (this->m_blocks).m_values.m_size) {
          local_58.field_1 =
               (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
               pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar6,0);
          uVar6 = (this->m_blocks).m_width;
          if ((uVar6 <= uVar12) || ((this->m_blocks).m_height <= uVar10)) goto LAB_002510e4;
          uVar6 = uVar6 * uVar10 + uVar12;
          local_38 = &pColors->field_0;
          if (uVar6 < (this->m_blocks).m_values.m_size) {
            lVar13 = 0;
            local_5c.field_1 =
                 (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
                 pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar6,0);
            paVar4 = local_38;
            iVar9 = *(int *)(interpolate(int,int,basisu::color_rgba_const&,basisu::color_rgba_const&,basisu::color_rgba_const&,basisu::color_rgba_const&)
                             ::s_interp + (ulong)(x & 3) * 4);
            iVar2 = *(int *)(interpolate(int,int,basisu::color_rgba_const&,basisu::color_rgba_const&,basisu::color_rgba_const&,basisu::color_rgba_const&)
                             ::s_interp + (ulong)((uint)local_48 & 3) * 4);
            do {
              iVar5 = ((uint)local_54.m_comps[lVar13] - (uint)local_50.m_comps[lVar13]) * iVar9 +
                      (uint)local_50.m_comps[lVar13] * 4;
              iVar5 = (((uint)local_58.m_comps[lVar13] * 4 - iVar5) +
                      ((uint)local_5c.m_comps[lVar13] - (uint)local_58.m_comps[lVar13]) * iVar9) *
                      iVar2 + iVar5 * 4;
              if (lVar13 == 3) {
                iVar7 = iVar5 >> 4;
              }
              else {
                iVar7 = iVar5 >> 1;
                iVar5 = iVar5 >> 6;
              }
              local_40 = uVar3;
              if (0xff < (uint)(iVar5 + iVar7)) goto LAB_002510c5;
              local_4c.m_comps[lVar13] = (uint8_t)(iVar5 + iVar7);
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            *local_38 = local_4c;
            uVar6 = (this->m_blocks).m_width;
            if ((uVar6 <= uVar8) || ((this->m_blocks).m_height <= uVar11)) goto LAB_002510e4;
            uVar6 = uVar6 * uVar11 + uVar8;
            if (uVar6 < (this->m_blocks).m_values.m_size) {
              local_50.field_1 =
                   (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
                   pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar6,1);
              uVar6 = (this->m_blocks).m_width;
              if ((uVar6 <= uVar12) || ((this->m_blocks).m_height <= uVar11)) goto LAB_002510e4;
              uVar11 = uVar6 * uVar11 + uVar12;
              if (uVar11 < (this->m_blocks).m_values.m_size) {
                local_54.field_1 =
                     (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
                     pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar11,1);
                uVar11 = (this->m_blocks).m_width;
                if ((uVar11 <= uVar8) || ((this->m_blocks).m_height <= uVar10)) goto LAB_002510e4;
                uVar8 = uVar11 * uVar10 + uVar8;
                if (uVar8 < (this->m_blocks).m_values.m_size) {
                  local_58.field_1 =
                       (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
                       pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar8,1);
                  uVar11 = (this->m_blocks).m_width;
                  if ((uVar11 <= uVar12) || ((this->m_blocks).m_height <= uVar10))
                  goto LAB_002510e4;
                  uVar12 = uVar11 * uVar10 + uVar12;
                  if (uVar12 < (this->m_blocks).m_values.m_size) {
                    local_5c.field_1 =
                         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
                         pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar12,1);
                    lVar13 = 0;
                    do {
                      iVar5 = ((uint)local_54.m_comps[lVar13] - (uint)local_50.m_comps[lVar13]) *
                              iVar9 + (uint)local_50.m_comps[lVar13] * 4;
                      iVar5 = (((uint)local_58.m_comps[lVar13] * 4 - iVar5) +
                              ((uint)local_5c.m_comps[lVar13] - (uint)local_58.m_comps[lVar13]) *
                              iVar9) * iVar2 + iVar5 * 4;
                      if (lVar13 == 3) {
                        iVar7 = iVar5 >> 4;
                      }
                      else {
                        iVar7 = iVar5 >> 1;
                        iVar5 = iVar5 >> 6;
                      }
                      if (0xff < (uint)(iVar5 + iVar7)) {
LAB_002510c5:
                        __assert_fail("(v >= 0) && (v < 256)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_pvrtc1_4.h"
                                      ,0x165,
                                      "color_rgba basisu::pvrtc4_image::interpolate(int, int, const color_rgba &, const color_rgba &, const color_rgba &, const color_rgba &) const"
                                     );
                      }
                      local_4c.m_comps[lVar13] = (uint8_t)(iVar5 + iVar7);
                      lVar13 = lVar13 + 1;
                    } while (lVar13 != 4);
                    paVar4[3] = local_4c;
                    uVar8 = (uint)(local_40 >> 2) & 0x3fffffff;
                    uVar11 = (this->m_blocks).m_width;
                    if ((uVar11 <= uVar8) ||
                       (uVar12 = (uint)(local_48 >> 2) & 0x3fffffff,
                       (this->m_blocks).m_height <= uVar12)) goto LAB_002510e4;
                    uVar8 = uVar11 * uVar12 + uVar8;
                    if (uVar8 < (this->m_blocks).m_values.m_size) {
                      uVar11 = (this->m_blocks).m_values.m_p[uVar8].m_endpoints;
                      auVar17 = pmovzxbw(ZEXT416((uint)*(
                                                  anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1
                                                  *)paVar4),
                                         ZEXT416((uint)*(
                                                  anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1
                                                  *)paVar4));
                      sVar14 = auVar17._0_2_;
                      sVar21 = auVar17._2_2_;
                      sVar22 = auVar17._4_2_;
                      sVar23 = auVar17._6_2_;
                      sVar24 = auVar17._8_2_;
                      sVar25 = auVar17._10_2_;
                      sVar26 = auVar17._12_2_;
                      sVar27 = auVar17._14_2_;
                      if ((uVar11 & 1) == 0) {
                        auVar17 = psllw(auVar17,2);
                        auVar18 = pmovzxbw(ZEXT416((uint)paVar4[3]),ZEXT416((uint)paVar4[3]));
                        auVar28._0_2_ = (ushort)(auVar18._0_2_ * 3 + auVar17._0_2_ + sVar14) >> 3;
                        auVar28._2_2_ = (ushort)(auVar18._2_2_ * 3 + auVar17._2_2_ + sVar21) >> 3;
                        auVar28._4_2_ = (ushort)(auVar18._4_2_ * 3 + auVar17._4_2_ + sVar22) >> 3;
                        auVar28._6_2_ = (ushort)(auVar18._6_2_ * 3 + auVar17._6_2_ + sVar23) >> 3;
                        auVar28._8_2_ = (ushort)(auVar18._8_2_ * 3 + auVar17._8_2_ + sVar24) >> 3;
                        auVar28._10_2_ = (ushort)(auVar18._10_2_ * 3 + auVar17._10_2_ + sVar25) >> 3
                        ;
                        auVar28._12_2_ = (ushort)(auVar18._12_2_ * 3 + auVar17._12_2_ + sVar26) >> 3
                        ;
                        auVar28._14_2_ = (ushort)(auVar18._14_2_ * 3 + auVar17._14_2_ + sVar27) >> 3
                        ;
                        auVar17 = pshufb(auVar28,ZEXT416(0x6040200));
                        paVar4[1] = auVar17._0_4_;
                        auVar17 = psllw(auVar18,2);
                        auVar20._0_2_ = (ushort)(auVar17._0_2_ + auVar18._0_2_ + sVar14 * 3) >> 3;
                        auVar20._2_2_ = (ushort)(auVar17._2_2_ + auVar18._2_2_ + sVar21 * 3) >> 3;
                        auVar20._4_2_ = (ushort)(auVar17._4_2_ + auVar18._4_2_ + sVar22 * 3) >> 3;
                        auVar20._6_2_ = (ushort)(auVar17._6_2_ + auVar18._6_2_ + sVar23 * 3) >> 3;
                        auVar20._8_2_ = (ushort)(auVar17._8_2_ + auVar18._8_2_ + sVar24 * 3) >> 3;
                        auVar20._10_2_ = (ushort)(auVar17._10_2_ + auVar18._10_2_ + sVar25 * 3) >> 3
                        ;
                        auVar20._12_2_ = (ushort)(auVar17._12_2_ + auVar18._12_2_ + sVar26 * 3) >> 3
                        ;
                        auVar20._14_2_ = (ushort)(auVar17._14_2_ + auVar18._14_2_ + sVar27 * 3) >> 3
                        ;
                        auVar17 = pshufb(auVar20,ZEXT416(0x6040200));
                        paVar4[2] = auVar17._0_4_;
                      }
                      else {
                        auVar16[1] = (0 < sVar21) * (sVar21 < 0x100) * auVar17[2] - (0xff < sVar21);
                        auVar16[0] = (0 < sVar14) * (sVar14 < 0x100) * auVar17[0] - (0xff < sVar14);
                        auVar16[2] = (0 < sVar22) * (sVar22 < 0x100) * auVar17[4] - (0xff < sVar22);
                        auVar16[3] = (0 < sVar23) * (sVar23 < 0x100) * auVar17[6] - (0xff < sVar23);
                        auVar16._4_3_ = 0;
                        auVar16[7] = (0 < sVar27) * (sVar27 < 0x100) * auVar17[0xe] -
                                     (0xff < sVar27);
                        auVar16[8] = (0 < sVar14) * (sVar14 < 0x100) * auVar17[0] - (0xff < sVar14);
                        auVar16[9] = (0 < sVar21) * (sVar21 < 0x100) * auVar17[2] - (0xff < sVar21);
                        auVar16[10] = (0 < sVar22) * (sVar22 < 0x100) * auVar17[4] - (0xff < sVar22)
                        ;
                        auVar16[0xb] = (0 < sVar23) * (sVar23 < 0x100) * auVar17[6] -
                                       (0xff < sVar23);
                        auVar16[0xc] = (0 < sVar24) * (sVar24 < 0x100) * auVar17[8] -
                                       (0xff < sVar24);
                        auVar16[0xd] = (0 < sVar25) * (sVar25 < 0x100) * auVar17[10] -
                                       (0xff < sVar25);
                        auVar16[0xe] = (0 < sVar26) * (sVar26 < 0x100) * auVar17[0xc] -
                                       (0xff < sVar26);
                        auVar18[0xf] = (0 < sVar27) * (sVar27 < 0x100) * auVar17[0xe] -
                                       (0xff < sVar27);
                        auVar18._0_15_ = auVar16;
                        auVar17[0xf] = 0;
                        auVar17._0_15_ = auVar16;
                        auVar17 = ZEXT416((uint)paVar4[3]) & auVar17;
                        auVar18 = auVar18 ^ ZEXT416((uint)paVar4[3]);
                        auVar19._0_2_ = auVar18._0_2_ >> 1;
                        auVar19._2_2_ = auVar18._2_2_ >> 1;
                        auVar19._4_4_ = 0;
                        auVar19._8_2_ = auVar18._8_2_ >> 1;
                        auVar19._10_2_ = auVar18._10_2_ >> 1;
                        auVar19._12_2_ = auVar18._12_2_ >> 1;
                        auVar19._14_2_ = auVar18._14_2_ >> 1;
                        auVar19 = auVar19 & _DAT_0027d880;
                        aVar15._0_1_ = auVar19[0] + auVar17[0];
                        aVar15._1_1_ = auVar19[1] + auVar17[1];
                        aVar15._2_1_ = auVar19[2] + auVar17[2];
                        aVar15._3_1_ = auVar19[3] + auVar17[3];
                        paVar4[1] = aVar15;
                        paVar4[2] = aVar15;
                        *(undefined1 *)((long)paVar4 + 0xb) = 0;
                      }
                      return (bool)((byte)uVar11 & 1);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __assert_fail("i < m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x177,
                  "const T &basisu::vector<basisu::pvrtc4_block>::operator[](size_t) const [T = basisu::pvrtc4_block]"
                 );
  }
LAB_002510e4:
  __assert_fail("x < m_width && y < m_height",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                ,0xd29,
                "const T &basisu::vector2D<basisu::pvrtc4_block>::operator()(uint32_t, uint32_t) const [T = basisu::pvrtc4_block]"
               );
}

Assistant:

bool pvrtc4_image::get_interpolated_colors(uint32_t x, uint32_t y, color_rgba* pColors) const
	{
		assert((x < m_width) && (y < m_height));

		int block_x0 = (static_cast<int>(x) - 2) >> 2;
		int block_x1 = block_x0 + 1;
		int block_y0 = (static_cast<int>(y) - 2) >> 2;
		int block_y1 = block_y0 + 1;
		
		block_x0 = posmod(block_x0, m_block_width);
		block_x1 = posmod(block_x1, m_block_width);
		block_y0 = posmod(block_y0, m_block_height);
		block_y1 = posmod(block_y1, m_block_height);
		
		pColors[0] = interpolate(x, y, m_blocks(block_x0, block_y0).get_endpoint_5554(0), m_blocks(block_x1, block_y0).get_endpoint_5554(0), m_blocks(block_x0, block_y1).get_endpoint_5554(0), m_blocks(block_x1, block_y1).get_endpoint_5554(0));
		pColors[3] = interpolate(x, y, m_blocks(block_x0, block_y0).get_endpoint_5554(1), m_blocks(block_x1, block_y0).get_endpoint_5554(1), m_blocks(block_x0, block_y1).get_endpoint_5554(1), m_blocks(block_x1, block_y1).get_endpoint_5554(1));

		if (get_block_uses_transparent_modulation(x >> 2, y >> 2))
		{
			for (uint32_t c = 0; c < 4; c++)
			{
				uint32_t m = (pColors[0][c] + pColors[3][c]) / 2;
				pColors[1][c] = static_cast<uint8_t>(m);
				pColors[2][c] = static_cast<uint8_t>(m);
			}
			pColors[2][3] = 0;
			return true;
		}

		for (uint32_t c = 0; c < 4; c++)
		{
			pColors[1][c] = static_cast<uint8_t>((pColors[0][c] * 5 + pColors[3][c] * 3) / 8);
			pColors[2][c] = static_cast<uint8_t>((pColors[0][c] * 3 + pColors[3][c] * 5) / 8);
		}

		return false;
	}